

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>::FunctionMockerBase
          (FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0039db38;
  MockSpec<MockProblemBuilder::MutVariable_&(int)>::MockSpec
            ((MockSpec<MockProblemBuilder::MutVariable_&(int)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}